

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

int __thiscall vmtz_trans::compare_to(vmtz_trans *this,int32_t dayno,int32_t daytime,int local)

{
  int iVar1;
  int32_t dd;
  int local_28;
  int local_24;
  
  local_28 = this->dayno;
  local_24 = this->daytime;
  if (local != 0) {
    local_24 = local_24 + this->ttype->gmtofs + this->ttype->save;
    caldate_t::normalize(&local_28,&local_24);
  }
  iVar1 = local_28 - dayno;
  if (local_28 - dayno == 0) {
    iVar1 = local_24 - daytime;
  }
  return iVar1;
}

Assistant:

int vmtz_trans::compare_to(int32_t dayno, int32_t daytime, int local) const
{
    /* get my value, converting to local time if required */
    int32_t dd = this->dayno, tt = this->daytime;
    if (local)
    {
        tt += ttype->gmtofs + ttype->save;
        caldate_t::normalize(dd, tt);
    }
    
    /* compare by day, then by time if on the same day */
    return (dd != dayno ? dd - dayno : tt - daytime);
}